

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datafile.c
# Opt level: O2

void write_flags(ang_file *fff,char *intro_text,bitflag *flags,int flag_size,char **names)

{
  int iVar1;
  size_t sVar2;
  int iVar3;
  char buf [1024];
  
  iVar3 = 0;
  memset(buf,0,0x400);
  iVar1 = 1;
  while( true ) {
    iVar1 = flag_next(flags,(long)flag_size,iVar1);
    if (iVar1 == 0) break;
    if (buf[0] != '\0') {
      my_strcat(buf," | ",0x400);
      iVar3 = iVar3 + 3;
    }
    if (names[iVar1] == (char *)0x0) break;
    my_strcat(buf,names[iVar1],0x400);
    sVar2 = strlen(names[iVar1]);
    iVar3 = iVar3 + (int)sVar2;
    if (0x3b < iVar3) {
      iVar3 = 0;
      file_putf(fff,"%s%s\n",intro_text,buf);
      my_strcpy(buf,"",0x400);
    }
    iVar1 = iVar1 + 1;
  }
  if (iVar3 != 0) {
    file_putf(fff,"%s%s\n",intro_text,buf);
  }
  return;
}

Assistant:

void write_flags(ang_file *fff, const char *intro_text, const bitflag *flags,
					   int flag_size, const char *names[])
{
	int flag;
	char buf[1024] = "";
	int pointer = 0;

	/* Write flag name list */
	for (flag = flag_next(flags, flag_size, FLAG_START); flag != FLAG_END;
		 flag = flag_next(flags, flag_size, flag + 1)) {

		/* Write the flags, keeping track of where we are */
		if (strlen(buf)) {
			my_strcat(buf, " | ", sizeof(buf));
			pointer += 3;
		}

		/* If no name, we're past the real flags */
		if (!names[flag]) break;
		my_strcat(buf, names[flag], sizeof(buf));
		pointer += strlen(names[flag]);

		/* Move to a new line if this one is long enough */
		if (pointer >= 60) {
			file_putf(fff, "%s%s\n", intro_text, buf);
			my_strcpy(buf, "", sizeof(buf));
			pointer = 0;
		}
	}

	/* Print remaining flags if any */
	if (pointer)
		file_putf(fff, "%s%s\n", intro_text, buf);
}